

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

SummaryColumn * __thiscall
Catch::ConsoleReporter::SummaryColumn::addRow
          (SummaryColumn *__return_storage_ptr__,SummaryColumn *this,size_t count)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  SummaryColumn *pSVar1;
  undefined8 uVar2;
  pointer __rhs;
  ostringstream local_1f8 [8];
  ostringstream oss;
  ios_base local_188 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  SummaryColumn *local_60;
  undefined1 local_58 [8];
  string row;
  
  std::__cxx11::ostringstream::ostringstream(local_1f8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
  local_60 = __return_storage_ptr__;
  std::__cxx11::stringbuf::str();
  __rhs = (this->rows).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  row.field_2._8_8_ = this;
  if (__rhs != (this->rows).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      while ((pointer)__rhs->_M_string_length < row._M_dataplus._M_p) {
        std::operator+(&local_80," ",__rhs);
        std::__cxx11::string::operator=((string *)__rhs,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      while (row._M_dataplus._M_p < (pointer)__rhs->_M_string_length) {
        std::operator+(&local_80," ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
        std::__cxx11::string::operator=((string *)local_58,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      __rhs = __rhs + 1;
    } while (__rhs != *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       (row.field_2._8_8_ + 0x30));
  }
  uVar2 = row.field_2._8_8_;
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(row.field_2._8_8_ + 0x28);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,(value_type *)local_58);
  pSVar1 = local_60;
  (local_60->label)._M_dataplus._M_p = (pointer)&(local_60->label).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,*(long *)uVar2,*(long *)(uVar2 + 8) + *(long *)uVar2);
  pSVar1->colour = *(Code *)(uVar2 + 0x20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&pSVar1->rows,this_00);
  if (local_58 != (undefined1  [8])&row._M_string_length) {
    operator_delete((void *)local_58,row._M_string_length + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1f8);
  std::ios_base::~ios_base(local_188);
  return pSVar1;
}

Assistant:

SummaryColumn addRow( std::size_t count ) {
                std::ostringstream oss;
                oss << count;
                std::string row = oss.str();
                for( std::vector<std::string>::iterator it = rows.begin(); it != rows.end(); ++it ) {
                    while( it->size() < row.size() )
                        *it = " " + *it;
                    while( it->size() > row.size() )
                        row = " " + row;
                }
                rows.push_back( row );
                return *this;
            }